

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::HttpHeaderTable::~HttpHeaderTable(HttpHeaderTable *this)

{
  Own<kj::HttpHeaderTable::IdsByNameMap,_std::nullptr_t>::dispose(&this->idsByName);
  ArrayBuilder<kj::StringPtr>::dispose((ArrayBuilder<kj::StringPtr> *)this);
  return;
}

Assistant:

HttpHeaderTable::~HttpHeaderTable() noexcept(false) {}